

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O0

void decode_nvrm_mthd_context_list_devices(nvrm_mthd_context_list_devices *m)

{
  uint local_14;
  int j;
  nvrm_mthd_context_list_devices *m_local;
  
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    if ((m->gpu_id[(int)local_14] != 0) && (m->gpu_id[(int)local_14] != 0xffffffff)) {
      fprintf(_stdout,"gpu_id[%d]: 0x%08x ",(ulong)local_14,(ulong)m->gpu_id[(int)local_14]);
    }
  }
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_context_list_devices(struct nvrm_mthd_context_list_devices *m)
{
	int j;
	for (j = 0; j < 32; ++j)
		if (m->gpu_id[j] != 0 && m->gpu_id[j] != 0xffffffff)
			mmt_log_cont("gpu_id[%d]: 0x%08x ", j, m->gpu_id[j]);
	nvrm_print_ln();
}